

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O3

unique_ptr<spvtools::opt::analysis::FloatConstant,_std::default_delete<spvtools::opt::analysis::FloatConstant>_>
 __thiscall spvtools::opt::analysis::FloatConstant::CopyFloatConstant(FloatConstant *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  
  p_Var1 = (_func_int *)(**(code **)(**(long **)(in_RSI + 8) + 0x60))();
  pp_Var2 = (_func_int **)operator_new(0x28);
  pp_Var2[1] = p_Var1;
  *pp_Var2 = (_func_int *)&PTR__ScalarConstant_003dd618;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(pp_Var2 + 2),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x10));
  *pp_Var2 = (_func_int *)&PTR__ScalarConstant_003dd7e0;
  (this->super_ScalarConstant).super_Constant._vptr_Constant = pp_Var2;
  return (__uniq_ptr_data<spvtools::opt::analysis::FloatConstant,_std::default_delete<spvtools::opt::analysis::FloatConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::FloatConstant,_std::default_delete<spvtools::opt::analysis::FloatConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FloatConstant> CopyFloatConstant() const {
    return MakeUnique<FloatConstant>(type_->AsFloat(), words_);
  }